

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.h
# Opt level: O1

BranchJumpTableWrapper * BranchJumpTableWrapper::New(JitArenaAllocator *allocator,uint tableSize)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  BranchJumpTableWrapper *pBVar4;
  undefined4 *puVar5;
  void **__s;
  ulong uVar6;
  size_t requestedBytes;
  
  pBVar4 = (BranchJumpTableWrapper *)new<Memory::JitArenaAllocator>(0x20,allocator,0x3f1274);
  pBVar4->jmpTable = (void **)0x0;
  pBVar4->defaultTarget = (void *)0x0;
  pBVar4->labelInstr = (LabelInstr *)0x0;
  pBVar4->tableSize = tableSize;
  if (tableSize == 0) {
    __s = (void **)&DAT_00000008;
  }
  else {
    BVar3 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar3 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                         "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar2) goto LAB_006302cb;
      *puVar5 = 0;
    }
    uVar6 = (ulong)tableSize;
    requestedBytes = uVar6 * 8;
    __s = (void **)Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                   AllocInternal((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                  *)allocator,requestedBytes);
    memset(__s,0,requestedBytes);
    memset(__s + uVar6,0,(requestedBytes + 0xf & 0xfffffffffffffff0) + uVar6 * -8);
    if (__s == (void **)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar2) {
LAB_006302cb:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
  }
  pBVar4->jmpTable = __s;
  return pBVar4;
}

Assistant:

static BranchJumpTableWrapper* New(JitArenaAllocator * allocator, uint tableSize)
    {
        BranchJumpTableWrapper * branchTargets = JitAnew(allocator, BranchJumpTableWrapper, tableSize);

        //Create the jump table for integers

        void* * jmpTable = JitAnewArrayZ(allocator, void*, tableSize);
        branchTargets->jmpTable = jmpTable;
        return branchTargets;
    }